

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type_Tag.cpp
# Opt level: O0

ostream * psy::C::operator<<(ostream *os,TagType *tagTy)

{
  TagType *os_00;
  TagTypeKind tagTyK;
  ostream *poVar1;
  Lexeme *this;
  string local_40;
  TagType *local_20;
  TagType *tagTy_local;
  ostream *os_local;
  
  local_20 = tagTy;
  tagTy_local = (TagType *)os;
  if (tagTy == (TagType *)0x0) {
    os_local = std::operator<<(os,"<TagType is null>");
  }
  else {
    std::operator<<(os,"<TagType | ");
    os_00 = tagTy_local;
    tagTyK = TagType::kind(local_20);
    operator<<((ostream *)os_00,tagTyK);
    poVar1 = std::operator<<((ostream *)tagTy_local," tag:");
    this = &TagType::tag(local_20)->super_Lexeme;
    Lexeme::valueText_abi_cxx11_(&local_40,this);
    std::operator<<(poVar1,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::operator<<((ostream *)tagTy_local,">");
    os_local = (ostream *)tagTy_local;
  }
  return os_local;
}

Assistant:

PSY_C_API std::ostream& operator<<(std::ostream& os, const TagType* tagTy)
{
    if (!tagTy)
        return os << "<TagType is null>";
    os << "<TagType | ";
    os << tagTy->kind();
    os << " tag:" << tagTy->tag()->valueText();
    os << ">";
    return os;
}